

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O1

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint uVar2;
  TValue *pTVar3;
  bool bVar4;
  GCstr *key;
  cTValue *pcVar5;
  cTValue *pcVar6;
  VMEvent key_00;
  GCtab *t;
  
  uVar2 = (L->glref).ptr32;
  key = lj_str_new(L,"_VMEVENTS",9);
  pcVar5 = lj_tab_getstr((GCtab *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x118),key);
  if ((pcVar5->field_2).it == 0xfffffff4) {
    key_00 = ev & 0xfffffff8;
    t = (GCtab *)(ulong)(pcVar5->u32).lo;
    if ((uint)key_00 < t->asize) {
      pcVar6 = (cTValue *)(ulong)(t->array).ptr32;
      pcVar5 = pcVar6 + key_00;
    }
    else {
      pcVar6 = lj_tab_getinth(t,key_00);
      pcVar5 = pcVar6;
    }
    bVar4 = true;
    if ((pcVar5 != (cTValue *)0x0) && ((pcVar5->field_2).it == 0xfffffff7)) {
      if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0xa1) {
        lj_state_growstack(L,0x14);
      }
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      (pTVar3->field_2).field_0 = (pcVar5->field_2).field_0;
      (pTVar3->field_2).it = 0xfffffff7;
      pcVar6 = (cTValue *)((long)L->top - (ulong)(L->stack).ptr32);
      bVar4 = false;
    }
    if (!bVar4) {
      return (ptrdiff_t)pcVar6;
    }
  }
  pbVar1 = (byte *)((ulong)uVar2 + 0x10b);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      if (LJ_FR2) setnilV(L->top++);
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}